

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builtins.h
# Opt level: O0

void __thiscall slang::ast::builtins::Builtins::Builtins(Builtins *this)

{
  long in_RDI;
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<slang::ast::SystemSubroutine>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  *this_00;
  Builtins *in_stack_00000100;
  Builtins *in_stack_00000150;
  Builtins *in_stack_000001d0;
  Builtins *in_stack_000001e0;
  Builtins *in_stack_00000260;
  Builtins *in_stack_000003a0;
  Builtins *in_stack_00000590;
  Builtins *in_stack_00000920;
  Builtins *in_stack_00000b80;
  Builtins *in_stack_00001b60;
  Kind in_stack_ffffffffffffffac;
  PredefinedIntegerType *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar1;
  undefined4 uVar2;
  Kind floatKind_;
  FloatingType *in_stack_ffffffffffffffd0;
  PredefinedIntegerType *in_stack_ffffffffffffffe0;
  
  uVar1 = 0;
  ScalarType::ScalarType((ScalarType *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  uVar2 = 1;
  ScalarType::ScalarType((ScalarType *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  floatKind_ = RealTime;
  ScalarType::ScalarType((ScalarType *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  ScalarType::ScalarType
            ((ScalarType *)in_stack_ffffffffffffffe0,(Kind)((ulong)in_RDI >> 0x20),
             SUB81((ulong)in_RDI >> 0x18,0));
  ScalarType::ScalarType
            ((ScalarType *)in_stack_ffffffffffffffe0,(Kind)((ulong)in_RDI >> 0x20),
             SUB81((ulong)in_RDI >> 0x18,0));
  ScalarType::ScalarType
            ((ScalarType *)in_stack_ffffffffffffffe0,(Kind)((ulong)in_RDI >> 0x20),
             SUB81((ulong)in_RDI >> 0x18,0));
  PredefinedIntegerType::PredefinedIntegerType(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  PredefinedIntegerType::PredefinedIntegerType
            (in_stack_ffffffffffffffe0,(Kind)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0))
  ;
  PredefinedIntegerType::PredefinedIntegerType(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  PredefinedIntegerType::PredefinedIntegerType(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  PredefinedIntegerType::PredefinedIntegerType(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  PredefinedIntegerType::PredefinedIntegerType(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  PredefinedIntegerType::PredefinedIntegerType
            (in_stack_ffffffffffffffe0,(Kind)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0))
  ;
  PredefinedIntegerType::PredefinedIntegerType(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  FloatingType::FloatingType(in_stack_ffffffffffffffd0,floatKind_);
  FloatingType::FloatingType(in_stack_ffffffffffffffd0,floatKind_);
  FloatingType::FloatingType(in_stack_ffffffffffffffd0,floatKind_);
  StringType::StringType((StringType *)CONCAT44(uVar1,in_stack_ffffffffffffffc0));
  VoidType::VoidType((VoidType *)CONCAT44(uVar1,in_stack_ffffffffffffffc0));
  CHandleType::CHandleType((CHandleType *)CONCAT44(uVar1,in_stack_ffffffffffffffc0));
  NullType::NullType((NullType *)CONCAT44(uVar1,in_stack_ffffffffffffffc0));
  EventType::EventType((EventType *)CONCAT44(uVar1,in_stack_ffffffffffffffc0));
  UnboundedType::UnboundedType((UnboundedType *)CONCAT44(uVar1,in_stack_ffffffffffffffc0));
  TypeRefType::TypeRefType((TypeRefType *)CONCAT44(uVar1,in_stack_ffffffffffffffc0));
  UntypedType::UntypedType((UntypedType *)CONCAT44(uVar1,in_stack_ffffffffffffffc0));
  SequenceType::SequenceType((SequenceType *)CONCAT44(uVar1,in_stack_ffffffffffffffc0));
  PropertyType::PropertyType((PropertyType *)CONCAT44(uVar1,in_stack_ffffffffffffffc0));
  ErrorType::ErrorType((ErrorType *)CONCAT44(uVar1,in_stack_ffffffffffffffc0));
  this_00 = (unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<slang::ast::SystemSubroutine>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
             *)(in_RDI + 0x8d8);
  std::
  vector<std::shared_ptr<slang::ast::SystemSubroutine>,_std::allocator<std::shared_ptr<slang::ast::SystemSubroutine>_>_>
  ::vector((vector<std::shared_ptr<slang::ast::SystemSubroutine>,_std::allocator<std::shared_ptr<slang::ast::SystemSubroutine>_>_>
            *)0x7df27b);
  boost::unordered::
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<slang::ast::SystemSubroutine>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  ::unordered_flat_map(this_00);
  boost::unordered::
  unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  ::unordered_flat_map
            ((unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
              *)this_00);
  std::array<slang::parsing::KnownSystemName,_286UL>::size
            ((array<slang::parsing::KnownSystemName,_286UL> *)
             parsing::KnownSystemName_traits::values);
  std::
  vector<std::shared_ptr<slang::ast::SystemSubroutine>,_std::allocator<std::shared_ptr<slang::ast::SystemSubroutine>_>_>
  ::resize((vector<std::shared_ptr<slang::ast::SystemSubroutine>,_std::allocator<std::shared_ptr<slang::ast::SystemSubroutine>_>_>
            *)this_00,CONCAT44(floatKind_,uVar2));
  registerArrayMethods(in_stack_00000920);
  registerConversionFuncs(in_stack_00000150);
  registerCoverageFuncs(in_stack_000003a0);
  registerEnumMethods(in_stack_00000100);
  registerMathFuncs(in_stack_00000590);
  registerMiscSystemFuncs(in_stack_000001d0);
  registerNonConstFuncs(in_stack_00000b80);
  registerQueryFuncs(in_stack_000001e0);
  registerStringMethods(in_stack_00000260);
  registerSystemTasks(in_stack_00001b60);
  return;
}

Assistant:

Builtins() {
        systemSubroutines.resize(parsing::KnownSystemName_traits::values.size());

        registerArrayMethods();
        registerConversionFuncs();
        registerCoverageFuncs();
        registerEnumMethods();
        registerMathFuncs();
        registerMiscSystemFuncs();
        registerNonConstFuncs();
        registerQueryFuncs();
        registerStringMethods();
        registerSystemTasks();
    }